

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_WriteBoothPartialProducts(FILE *pFile,int nVars)

{
  uint n;
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Mini_Aig_t *p_00;
  int Lit1;
  int Lit0;
  int Lit;
  int nOut;
  int nDigits3;
  int nDigits2;
  int nDigits;
  int nNodes;
  int i;
  Mini_Aig_t *p;
  int nVars_local;
  FILE *pFile_local;
  
  p_00 = Abc_GenSignedBoothMini(nVars,nVars);
  n = Mini_AigNodeNum(p_00);
  uVar1 = Abc_Base10Log(nVars);
  iVar2 = Abc_Base10Log(nVars << 1);
  uVar3 = Abc_Base10Log(n);
  Lit0 = 0;
  fprintf((FILE *)pFile,".names pp%0*d\n",(ulong)uVar3,0);
  nDigits = 1;
  do {
    if ((int)n <= nDigits) {
      Mini_AigStop(p_00);
      return;
    }
    iVar4 = Mini_AigNodeIsPi(p_00,nDigits);
    if (iVar4 == 0) {
      iVar4 = Mini_AigNodeIsPo(p_00,nDigits);
      if (iVar4 == 0) {
        iVar4 = Mini_AigNodeIsAnd(p_00,nDigits);
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                        ,0x43f,"void Abc_WriteBoothPartialProducts(FILE *, int)");
        }
        iVar4 = Mini_AigNodeFanin0(p_00,nDigits);
        iVar6 = Mini_AigNodeFanin1(p_00,nDigits);
        uVar5 = Abc_Lit2Var(iVar4);
        uVar7 = Abc_Lit2Var(iVar6);
        iVar4 = Abc_LitIsCompl(iVar4);
        iVar6 = Abc_LitIsCompl(iVar6);
        fprintf((FILE *)pFile,".names pp%0*d pp%0*d pp%0*d\n%d%d 1\n",(ulong)uVar3,(ulong)uVar5,
                (ulong)uVar3,(ulong)uVar7,uVar3,nDigits,(uint)((iVar4 != 0 ^ 0xffU) & 1),
                (uint)((iVar6 != 0 ^ 0xffU) & 1));
      }
      else {
        iVar4 = Mini_AigNodeFanin0(p_00,nDigits);
        uVar5 = Abc_Lit2Var(iVar4);
        iVar4 = Abc_LitIsCompl(iVar4);
        fprintf((FILE *)pFile,".names pp%0*d y%0*d_%0*d\n%d 1\n",(ulong)uVar3,(ulong)uVar5,
                (ulong)uVar1,(ulong)(uint)(Lit0 / (nVars << 1)),iVar2,Lit0 % (nVars << 1),
                (uint)((iVar4 != 0 ^ 0xffU) & 1));
        Lit0 = Lit0 + 1;
      }
    }
    else if ((nDigits < 1) || (nVars < nDigits)) {
      if ((nDigits <= nVars) ||
         (nDigits != nVars * 2 && SBORROW4(nDigits,nVars * 2) == nDigits + nVars * -2 < 0)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                      ,0x430,"void Abc_WriteBoothPartialProducts(FILE *, int)");
      }
      fprintf((FILE *)pFile,".names b%0*d pp%0*d\n1 1\n",(ulong)uVar1,
              (ulong)(uint)((nDigits + -1) - nVars),(ulong)uVar3,(ulong)(uint)nDigits);
    }
    else {
      fprintf((FILE *)pFile,".names a%0*d pp%0*d\n1 1\n",(ulong)uVar1,(ulong)(nDigits - 1),
              (ulong)uVar3,(ulong)(uint)nDigits);
    }
    nDigits = nDigits + 1;
  } while( true );
}

Assistant:

void Abc_WriteBoothPartialProducts( FILE * pFile, int nVars )
{
    Mini_Aig_t * p = Abc_GenSignedBoothMini( nVars, nVars );
    int i, nNodes = Mini_AigNodeNum(p);
    int nDigits   = Abc_Base10Log( nVars );
    int nDigits2  = Abc_Base10Log( 2*nVars );
    int nDigits3  = Abc_Base10Log( nNodes );
    int nOut = 0;
    fprintf( pFile, ".names pp%0*d\n", nDigits3, 0 );
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
        {
            if ( i > 0 && i <= nVars )
                fprintf( pFile, ".names a%0*d pp%0*d\n1 1\n", nDigits, i-1,       nDigits3, i );
            else if ( i > nVars && i <= 2*nVars )
                fprintf( pFile, ".names b%0*d pp%0*d\n1 1\n", nDigits, i-1-nVars, nDigits3, i );
            else assert( 0 );
        }
        else if ( Mini_AigNodeIsPo( p, i ) )
        {
            int Lit = Mini_AigNodeFanin0( p, i );
            fprintf( pFile, ".names pp%0*d y%0*d_%0*d\n%d 1\n", nDigits3, Abc_Lit2Var(Lit), nDigits, nOut/(2*nVars), nDigits2, nOut%(2*nVars), !Abc_LitIsCompl(Lit) );
            nOut++;
        }
        else if ( Mini_AigNodeIsAnd( p, i ) )
        {
            int Lit0 = Mini_AigNodeFanin0( p, i );
            int Lit1 = Mini_AigNodeFanin1( p, i );
            fprintf( pFile, ".names pp%0*d pp%0*d pp%0*d\n%d%d 1\n", 
                nDigits3, Abc_Lit2Var(Lit0), nDigits3, Abc_Lit2Var(Lit1), nDigits3, i, !Abc_LitIsCompl(Lit0), !Abc_LitIsCompl(Lit1) );
        }
        else assert( 0 );
    }
    Mini_AigStop( p );
}